

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::calc_grad_adagrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM8 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_75;
  real_t local_74;
  real_t local_70;
  value_type_conflict1 local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  auVar24 = in_ZMM8._0_16_;
  auVar16._4_60_ = in_register_00001244;
  auVar16._0_4_ = norm;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = pg;
  auVar14 = auVar15._0_16_;
  local_74 = pg;
  local_70 = norm;
  if (norm < 0.0) {
    fVar8 = sqrtf(norm);
    auVar14 = ZEXT416((uint)local_74);
  }
  else {
    auVar19 = vsqrtss_avx(auVar16._0_16_,auVar16._0_16_);
    fVar8 = auVar19._0_4_;
  }
  lVar7 = *(long *)(model + 0x58);
  uVar3 = *(uint *)(model + 0x48);
  lVar11 = *(long *)(row + 8);
  for (lVar6 = *(long *)row; lVar6 != lVar11; lVar6 = lVar6 + 0xc) {
    if (*(uint *)(lVar6 + 4) < uVar3) {
      uVar9 = (ulong)(*(uint *)(lVar6 + 4) * 2);
      auVar17 = ZEXT416(*(uint *)(lVar7 + uVar9 * 4));
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * auVar14._0_4_ * *(float *)(lVar6 + 8))),
                                auVar17,ZEXT416((uint)(this->super_Score).regu_lambda_));
      auVar19 = vfmadd231ss_fma(ZEXT416(*(uint *)(lVar7 + 4 + uVar9 * 4)),auVar23,auVar23);
      fVar18 = auVar19._0_4_;
      *(float *)(lVar7 + 4 + uVar9 * 4) = fVar18;
      fVar12 = (float)(0x5f375a86 - ((int)fVar18 >> 1));
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar18 * -0.5 * fVar12)),ZEXT416((uint)fVar12),
                                SUB6416(ZEXT464(0x3fc00000),0));
      auVar19 = vfnmadd213ss_fma(ZEXT416((uint)(auVar23._0_4_ * (this->super_Score).learning_rate_))
                                 ,ZEXT416((uint)(auVar19._0_4_ * fVar12)),auVar17);
      *(int *)(lVar7 + uVar9 * 4) = auVar19._0_4_;
    }
  }
  puVar5 = *(uint **)(model + 0x68);
  auVar19 = vfmadd231ss_fma(ZEXT416(puVar5[1]),auVar14,auVar14);
  fVar12 = auVar19._0_4_;
  puVar5[1] = (uint)fVar12;
  fVar8 = (float)(0x5f375a86 - ((int)fVar12 >> 1));
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar12 * -0.5 * fVar8)),ZEXT416((uint)fVar8),
                            ZEXT416(0x3fc00000));
  auVar14 = vfnmadd213ss_fma(ZEXT416((uint)(auVar14._0_4_ * (this->super_Score).learning_rate_)),
                             ZEXT416((uint)(auVar19._0_4_ * fVar8)),ZEXT416(*puVar5));
  *puVar5 = auVar14._0_4_;
  auVar14 = vcvtusi2ss_avx512f(auVar24,*(undefined4 *)(model + 0x50));
  local_58._0_4_ = (this->super_Score).learning_rate_;
  local_58._4_4_ = (this->super_Score).regu_lambda_;
  local_58._8_4_ = (this->super_Score).alpha_;
  local_58._12_4_ = (this->super_Score).beta_;
  auVar14 = ZEXT416((uint)(auVar14._0_4_ * 0.25));
  auVar14 = vroundss_avx(auVar14,auVar14,10);
  iVar13 = vcvttss2usi_avx512f(auVar14);
  uVar9 = (ulong)(uint)(iVar13 << 2);
  auVar14 = vcvtusi2ss_avx512f(auVar24,iVar13 << 2);
  auVar24 = vcvtusi2ss_avx512f(auVar24,*(undefined4 *)(model + 0x54));
  local_68._0_4_ = (this->super_Score).regu_lambda_;
  local_68._4_4_ = (this->super_Score).alpha_;
  local_68._8_4_ = (this->super_Score).beta_;
  local_68._12_4_ = (this->super_Score).lambda_1_;
  local_6c = 0.0;
  iVar13 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar24._0_4_ * auVar14._0_4_)));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,uVar9,&local_6c,&local_75);
  for (lVar7 = *(long *)row; lVar7 != *(long *)(row + 8); lVar7 = lVar7 + 0xc) {
    uVar4 = *(uint *)(lVar7 + 4);
    if (uVar4 < uVar3) {
      fVar8 = local_70 * *(float *)(lVar7 + 8);
      lVar6 = *(long *)(model + 0x60);
      for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 4) {
        pfVar1 = (float *)((ulong)(uVar4 * iVar13) * 4 + lVar6 + uVar10 * 4);
        pfVar2 = local_48._M_impl.super__Vector_impl_data._M_start + uVar10;
        auVar14._0_4_ = fVar8 * *pfVar1 + *pfVar2;
        auVar14._4_4_ = fVar8 * pfVar1[1] + pfVar2[1];
        auVar14._8_4_ = fVar8 * pfVar1[2] + pfVar2[2];
        auVar14._12_4_ = fVar8 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])(local_48._M_impl.super__Vector_impl_data._M_start + uVar10) = auVar14
        ;
      }
    }
  }
  for (lVar6 = *(long *)row; lVar6 != lVar7; lVar6 = lVar6 + 0xc) {
    if (*(uint *)(lVar6 + 4) < uVar3) {
      fVar8 = local_70 * *(float *)(lVar6 + 8);
      lVar11 = (ulong)(*(uint *)(lVar6 + 4) * iVar13) * 4 + *(long *)(model + 0x60);
      lVar7 = lVar11 + uVar9 * 4;
      fVar12 = local_74 * fVar8;
      for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 4) {
        auVar14 = *(undefined1 (*) [16])(lVar11 + uVar10 * 4);
        auVar24._0_4_ = fVar8 * auVar14._0_4_;
        auVar24._4_4_ = fVar8 * auVar14._4_4_;
        auVar24._8_4_ = fVar8 * auVar14._8_4_;
        auVar24._12_4_ = fVar8 * auVar14._12_4_;
        auVar24 = vsubps_avx(*(undefined1 (*) [16])
                              (local_48._M_impl.super__Vector_impl_data._M_start + uVar10),auVar24);
        fVar18 = (float)local_68._0_4_ * auVar14._0_4_ + fVar12 * auVar24._0_4_;
        fVar20 = (float)local_68._0_4_ * auVar14._4_4_ + fVar12 * auVar24._4_4_;
        fVar21 = (float)local_68._0_4_ * auVar14._8_4_ + fVar12 * auVar24._8_4_;
        fVar22 = (float)local_68._0_4_ * auVar14._12_4_ + fVar12 * auVar24._12_4_;
        pfVar1 = (float *)(lVar7 + uVar10 * 4);
        auVar23._0_4_ = fVar18 * fVar18 + *pfVar1;
        auVar23._4_4_ = fVar20 * fVar20 + pfVar1[1];
        auVar23._8_4_ = fVar21 * fVar21 + pfVar1[2];
        auVar23._12_4_ = fVar22 * fVar22 + pfVar1[3];
        auVar24 = vrsqrtps_avx(auVar23);
        auVar19._0_4_ = (float)local_58._0_4_ * auVar24._0_4_ * fVar18;
        auVar19._4_4_ = (float)local_58._0_4_ * auVar24._4_4_ * fVar20;
        auVar19._8_4_ = (float)local_58._0_4_ * auVar24._8_4_ * fVar21;
        auVar19._12_4_ = (float)local_58._0_4_ * auVar24._12_4_ * fVar22;
        auVar14 = vsubps_avx(auVar14,auVar19);
        *(undefined1 (*) [16])(lVar11 + uVar10 * 4) = auVar14;
        *(undefined1 (*) [16])(lVar7 + uVar10 * 4) = auVar23;
      }
      lVar7 = *(long *)(row + 8);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FMScore::calc_grad_adagrad(const SparseRow* row,
                                Model& model,
                                real_t pg,
                                real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
      iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwg = _mm_load_ps(w+aligned_k+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
      _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMwg = _mm_add_ps(XMMwg, _mm_mul_ps(XMMg, XMMg));
      XMMw = _mm_sub_ps(XMMw,
             _mm_mul_ps(XMMlr,
             _mm_mul_ps(_mm_rsqrt_ps(XMMwg), XMMg)));
      _mm_store_ps(w+d, XMMw);
      _mm_store_ps(w+aligned_k+d, XMMwg);
    }
  }
}